

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_qrdmlsh_s16_aarch64(void *vd,void *vn,void *vm,void *ve,uint32_t desc)

{
  uint16_t uVar1;
  ulong uVar2;
  uintptr_t i;
  ulong uVar3;
  
  uVar3 = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 2) {
    uVar1 = inl_qrdmlsh_s16((CPUARMState_conflict *)ve,*(int16_t *)((long)vn + uVar2),
                            *(int16_t *)((long)vm + uVar2),*(int16_t *)((long)vd + uVar2));
    *(uint16_t *)((long)vd + uVar2) = uVar1;
  }
  for (; uVar3 < (desc >> 2 & 0xf8) + 8; uVar3 = uVar3 + 8) {
    *(undefined8 *)((long)vd + uVar3) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_qrdmlsh_s16)(void *vd, void *vn, void *vm,
                              void *ve, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    int16_t *d = vd;
    int16_t *n = vn;
    int16_t *m = vm;
    CPUARMState *env = ve;
    uintptr_t i;

    for (i = 0; i < opr_sz / 2; ++i) {
        d[i] = inl_qrdmlsh_s16(env, n[i], m[i], d[i]);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}